

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Gia_Man_t *
Gia_ManSpecReduce(Gia_Man_t *p,int fDualOut,int fSynthesis,int fSpeculate,int fSkipSome,int fVerbose
                 )

{
  Gia_Man_t *pGVar1;
  Gia_Man_t *p_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int local_70;
  int nAddPos;
  int iLit;
  Vec_Int_t *vGuide;
  Vec_Int_t *vTrace;
  int iLitNew;
  int i;
  Vec_Int_t *vXorLits;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int local_28;
  int fVerbose_local;
  int fSkipSome_local;
  int fSpeculate_local;
  int fSynthesis_local;
  int fDualOut_local;
  Gia_Man_t *p_local;
  
  vGuide = (Vec_Int_t *)0x0;
  _nAddPos = (Vec_Int_t *)0x0;
  pNew._4_4_ = fVerbose;
  local_28 = fSkipSome;
  fVerbose_local = fSpeculate;
  fSkipSome_local = fSynthesis;
  fSpeculate_local = fDualOut;
  _fSynthesis_local = p;
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    Abc_Print(1,"Gia_ManSpecReduce(): Equivalence classes are not available.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  else if ((fDualOut == 0) || (uVar2 = Gia_ManPoNum(p), (uVar2 & 1) == 0)) {
    if (local_28 != 0) {
      _nAddPos = Vec_IntAlloc(100);
      pObj = (Gia_Obj_t *)Gia_ManSpecReduceTrace(_fSynthesis_local,_nAddPos,(Vec_Int_t *)0x0);
      Gia_ManStop((Gia_Man_t *)pObj);
      iVar3 = Vec_IntSize(_nAddPos);
      iVar4 = Gia_ManEquivCountLitsAll(_fSynthesis_local);
      if (iVar3 != iVar4) {
        __assert_fail("Vec_IntSize(vGuide) == Gia_ManEquivCountLitsAll(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x4be,"Gia_Man_t *Gia_ManSpecReduce(Gia_Man_t *, int, int, int, int, int)");
      }
      vGuide = Vec_IntAlloc(100);
    }
    _iLitNew = Vec_IntAlloc(1000);
    Gia_ManSetPhase(_fSynthesis_local);
    Gia_ManFillValue(_fSynthesis_local);
    if (fSpeculate_local != 0) {
      Gia_ManEquivSetColors(_fSynthesis_local,pNew._4_4_);
    }
    iVar3 = Gia_ManObjNum(_fSynthesis_local);
    pTemp = Gia_ManStart(iVar3);
    pcVar5 = Abc_UtilStrsav(_fSynthesis_local->pName);
    pTemp->pName = pcVar5;
    pcVar5 = Abc_UtilStrsav(_fSynthesis_local->pSpec);
    pTemp->pSpec = pcVar5;
    Gia_ManHashAlloc(pTemp);
    pGVar6 = Gia_ManConst0(_fSynthesis_local);
    pGVar6->Value = 0;
    vTrace._4_4_ = 0;
    while( true ) {
      iVar3 = vTrace._4_4_;
      iVar4 = Vec_IntSize(_fSynthesis_local->vCis);
      bVar7 = false;
      if (iVar3 < iVar4) {
        vXorLits = (Vec_Int_t *)Gia_ManCi(_fSynthesis_local,vTrace._4_4_);
        bVar7 = vXorLits != (Vec_Int_t *)0x0;
      }
      if (!bVar7) break;
      iVar3 = Gia_ManAppendCi(pTemp);
      *(int *)&vXorLits->pArray = iVar3;
      vTrace._4_4_ = vTrace._4_4_ + 1;
    }
    vTrace._4_4_ = 0;
    while( true ) {
      iVar3 = vTrace._4_4_;
      iVar4 = Gia_ManRegNum(_fSynthesis_local);
      pGVar1 = _fSynthesis_local;
      bVar7 = false;
      if (iVar3 < iVar4) {
        iVar3 = Gia_ManPiNum(_fSynthesis_local);
        vXorLits = (Vec_Int_t *)Gia_ManCi(pGVar1,iVar3 + vTrace._4_4_);
        bVar7 = vXorLits != (Vec_Int_t *)0x0;
      }
      if (!bVar7) break;
      Gia_ManSpecBuild(pTemp,_fSynthesis_local,(Gia_Obj_t *)vXorLits,_iLitNew,fSpeculate_local,
                       fVerbose_local,vGuide,_nAddPos,(Vec_Int_t *)0x0);
      vTrace._4_4_ = vTrace._4_4_ + 1;
    }
    vTrace._4_4_ = 0;
    while( true ) {
      iVar3 = vTrace._4_4_;
      iVar4 = Vec_IntSize(_fSynthesis_local->vCos);
      bVar7 = false;
      if (iVar3 < iVar4) {
        vXorLits = (Vec_Int_t *)Gia_ManCo(_fSynthesis_local,vTrace._4_4_);
        bVar7 = vXorLits != (Vec_Int_t *)0x0;
      }
      p_00 = _fSynthesis_local;
      pGVar1 = pTemp;
      if (!bVar7) break;
      pGVar6 = Gia_ObjFanin0((Gia_Obj_t *)vXorLits);
      Gia_ManSpecReduce_rec
                (pGVar1,p_00,pGVar6,_iLitNew,fSpeculate_local,fVerbose_local,vGuide,_nAddPos,
                 (Vec_Int_t *)0x0);
      vTrace._4_4_ = vTrace._4_4_ + 1;
    }
    if (fSkipSome_local == 0) {
      vTrace._4_4_ = 0;
      while( true ) {
        iVar3 = vTrace._4_4_;
        iVar4 = Gia_ManPoNum(_fSynthesis_local);
        bVar7 = false;
        if (iVar3 < iVar4) {
          vXorLits = (Vec_Int_t *)Gia_ManCo(_fSynthesis_local,vTrace._4_4_);
          bVar7 = vXorLits != (Vec_Int_t *)0x0;
        }
        pGVar1 = pTemp;
        if (!bVar7) break;
        iVar3 = Gia_ObjFanin0Copy((Gia_Obj_t *)vXorLits);
        Gia_ManAppendCo(pGVar1,iVar3);
        vTrace._4_4_ = vTrace._4_4_ + 1;
      }
    }
    for (vTrace._4_4_ = 0; iVar3 = vTrace._4_4_, iVar4 = Vec_IntSize(_iLitNew), iVar3 < iVar4;
        vTrace._4_4_ = vTrace._4_4_ + 1) {
      vTrace._0_4_ = Vec_IntEntry(_iLitNew,vTrace._4_4_);
      Gia_ManAppendCo(pTemp,(int)vTrace);
    }
    iVar3 = Vec_IntSize(_iLitNew);
    if (iVar3 == 0) {
      Abc_Print(1,"Speculatively reduced model has no primary outputs.\n");
      Gia_ManAppendCo(pTemp,0);
    }
    vTrace._4_4_ = 0;
    while( true ) {
      iVar3 = vTrace._4_4_;
      iVar4 = Gia_ManRegNum(_fSynthesis_local);
      pGVar1 = _fSynthesis_local;
      bVar7 = false;
      if (iVar3 < iVar4) {
        iVar3 = Gia_ManPoNum(_fSynthesis_local);
        vXorLits = (Vec_Int_t *)Gia_ManCo(pGVar1,iVar3 + vTrace._4_4_);
        bVar7 = vXorLits != (Vec_Int_t *)0x0;
      }
      pGVar1 = pTemp;
      if (!bVar7) break;
      iVar3 = Gia_ObjFanin0Copy((Gia_Obj_t *)vXorLits);
      Gia_ManAppendCo(pGVar1,iVar3);
      vTrace._4_4_ = vTrace._4_4_ + 1;
    }
    Gia_ManHashStop(pTemp);
    Vec_IntFree(_iLitNew);
    pGVar1 = pTemp;
    iVar3 = Gia_ManRegNum(_fSynthesis_local);
    Gia_ManSetRegNum(pGVar1,iVar3);
    pObj = (Gia_Obj_t *)pTemp;
    pTemp = Gia_ManCleanup(pTemp);
    Gia_ManStop((Gia_Man_t *)pObj);
    if (local_28 != 0) {
      local_70 = 0;
      for (vTrace._4_4_ = 0; iVar3 = vTrace._4_4_, iVar4 = Vec_IntSize(_nAddPos), iVar3 < iVar4;
          vTrace._4_4_ = vTrace._4_4_ + 1) {
        iVar3 = Vec_IntEntry(_nAddPos,vTrace._4_4_);
        if (iVar3 != 0) {
          local_70 = local_70 + 1;
        }
      }
      if (local_70 != 0) {
        iVar3 = Gia_ManPoNum(pTemp);
        iVar4 = Gia_ManPoNum(_fSynthesis_local);
        if (iVar3 != iVar4 + local_70) {
          __assert_fail("Gia_ManPoNum(pNew) == Gia_ManPoNum(p) + nAddPos",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x4ee,"Gia_Man_t *Gia_ManSpecReduce(Gia_Man_t *, int, int, int, int, int)")
          ;
        }
      }
    }
    Vec_IntFreeP(&vGuide);
    Vec_IntFreeP((Vec_Int_t **)&nAddPos);
    p_local = pTemp;
  }
  else {
    Abc_Print(1,"Gia_ManSpecReduce(): Dual-output miter should have even number of POs.\n");
    p_local = (Gia_Man_t *)0x0;
  }
  return p_local;
}

Assistant:

Gia_Man_t * Gia_ManSpecReduce( Gia_Man_t * p, int fDualOut, int fSynthesis, int fSpeculate, int fSkipSome, int fVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    Vec_Int_t * vXorLits;
    int i, iLitNew;
    Vec_Int_t * vTrace = NULL, * vGuide = NULL;
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManSpecReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    if ( fDualOut && (Gia_ManPoNum(p) & 1) )
    {
        Abc_Print( 1, "Gia_ManSpecReduce(): Dual-output miter should have even number of POs.\n" );
        return NULL;
    }
    if ( fSkipSome )
    {
        vGuide = Vec_IntAlloc( 100 );
        pTemp  = Gia_ManSpecReduceTrace( p, vGuide, NULL );
        Gia_ManStop( pTemp );
        assert( Vec_IntSize(vGuide) == Gia_ManEquivCountLitsAll(p) );
        vTrace = Vec_IntAlloc( 100 );
    }
    vXorLits = Vec_IntAlloc( 1000 );
    Gia_ManSetPhase( p );
    Gia_ManFillValue( p );
    if ( fDualOut )
        Gia_ManEquivSetColors( p, fVerbose );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachRo( p, pObj, i )
        Gia_ManSpecBuild( pNew, p, pObj, vXorLits, fDualOut, fSpeculate, vTrace, vGuide, NULL );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj), vXorLits, fDualOut, fSpeculate, vTrace, vGuide, NULL );
    if ( !fSynthesis )
    {
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    Vec_IntForEachEntry( vXorLits, iLitNew, i )
        Gia_ManAppendCo( pNew, iLitNew );
    if ( Vec_IntSize(vXorLits) == 0 )
    {
        Abc_Print( 1, "Speculatively reduced model has no primary outputs.\n" );
        Gia_ManAppendCo( pNew, 0 );
    }
    Gia_ManForEachRi( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Vec_IntFree( vXorLits );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );

    // update using trace
    if ( fSkipSome )
    {
        // count the number of non-zero entries
        int iLit, nAddPos = 0;
        Vec_IntForEachEntry( vGuide, iLit, i )
            if ( iLit )
                nAddPos++;
        if ( nAddPos )
            assert( Gia_ManPoNum(pNew) == Gia_ManPoNum(p) + nAddPos );
    }
    Vec_IntFreeP( &vTrace );
    Vec_IntFreeP( &vGuide );
    return pNew;
}